

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCaseResult.hpp
# Opt level: O1

void __thiscall xe::ri::ValueInfo::~ValueInfo(ValueInfo *this)

{
  ~ValueInfo(this);
  operator_delete(this,0x78);
  return;
}

Assistant:

~ValueInfo		(void) {}